

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Data_Query_PDU::Data_Query_PDU(Data_Query_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Data_Query_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Data_Query_PDU_0032ee88;
  DATA_TYPE::TimeStamp::TimeStamp(&this->m_TimeInterval);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_vFixedDatum);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_vVariableDatum);
  (*(this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,0);
  return;
}

Assistant:

Data_Query_PDU::Data_Query_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}